

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  string local_48;
  
  to_expression_abi_cxx11_(&local_48,this,id,true);
  pSVar3 = Compiler::expression_type(&this->super_Compiler,id);
  uVar2 = Compiler::get_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypeID);
  bVar1 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
  (*(this->super_Compiler)._vptr_Compiler[0x24])
            (__return_storage_ptr__,this,&local_48,pSVar3,(ulong)uVar2,(ulong)bVar1,1);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_unpacked_row_major_matrix_expression(uint32_t id)
{
	return unpack_expression_type(to_expression(id), expression_type(id),
	                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
	                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), true);
}